

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall kj::_::ExceptionOr<kj::String>::~ExceptionOr(ExceptionOr<kj::String> *this)

{
  char *pcVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  
  if (((this->value).ptr.isSet == true) &&
     (pcVar1 = (this->value).ptr.field_1.value.content.ptr, pcVar1 != (char *)0x0)) {
    sVar2 = (this->value).ptr.field_1.value.content.size_;
    (this->value).ptr.field_1.value.content.ptr = (char *)0x0;
    (this->value).ptr.field_1.value.content.size_ = 0;
    pAVar3 = (this->value).ptr.field_1.value.content.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar1,1,sVar2,sVar2,0);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr() = default;